

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

bool __thiscall
CommandLineParser::isOption(CommandLineParser *this,string *shortName,string *longName)

{
  __type _Var1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,"-",shortName);
  _Var1 = std::operator==(&this->m_option,&local_60);
  _Var2 = true;
  if (!_Var1) {
    std::operator+(&local_40,"--",longName);
    _Var2 = std::operator==(&this->m_option,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return _Var2;
}

Assistant:

bool 
CommandLineParser::isOption( const std::string &shortName,
                             const std::string &longName )
{
  return (m_option == "-" + shortName)  ||
         (m_option == "--" + longName);
}